

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_all_gather_sparse_vec.c
# Opt level: O2

int all_gather_sparse_vec(float *dense,int n_over_p,float **sparse_out,int **sparse_ivec_out)

{
  bsp_pid_t bVar1;
  bsp_pid_t bVar2;
  float *payload;
  int *piVar3;
  size_t __nmemb;
  float *pfVar4;
  int *tag;
  long lVar5;
  ulong uVar6;
  int nonzeros;
  float *local_68;
  int local_60;
  int status;
  int tag_size;
  int global_idx;
  float **local_50;
  int **local_48;
  ulong local_40;
  int nonzeros_size;
  
  local_68 = dense;
  local_50 = sparse_out;
  local_48 = sparse_ivec_out;
  bVar1 = bsp_nprocs();
  tag_size = 4;
  bsp_set_tagsize(&tag_size);
  bsp_sync();
  uVar6 = 0;
  if (bVar1 < 1) {
    bVar1 = 0;
  }
  local_40 = 0;
  if (0 < n_over_p) {
    local_40 = (ulong)(uint)n_over_p;
  }
  local_60 = n_over_p;
  for (; uVar6 != local_40; uVar6 = uVar6 + 1) {
    if ((local_68[uVar6] != 0.0) || (NAN(local_68[uVar6]))) {
      pfVar4 = local_68 + uVar6;
      bVar2 = bsp_pid();
      global_idx = bVar2 * local_60 + (int)uVar6;
      for (bVar2 = 0; bVar1 != bVar2; bVar2 = bVar2 + 1) {
        bsp_send(bVar2,&global_idx,pfVar4,4);
      }
    }
  }
  bsp_sync();
  bsp_qsize(&nonzeros,&nonzeros_size);
  __nmemb = (size_t)nonzeros;
  if ((long)__nmemb < 1) {
    piVar3 = (int *)0x0;
    pfVar4 = (float *)0x0;
  }
  else {
    payload = (float *)calloc(__nmemb,4);
    piVar3 = (int *)calloc(__nmemb,4);
    if (payload == (float *)0x0 || piVar3 == (int *)0x0) {
      bsp_abort("Unable to allocate memory\n");
    }
    tag = piVar3;
    local_68 = payload;
    for (lVar5 = 0; pfVar4 = local_68, lVar5 < nonzeros; lVar5 = lVar5 + 1) {
      bsp_get_tag(&status,tag);
      if (status != 4) {
        printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_all_gather_sparse_vec.c:%d\n"
               ,"status","(int) sizeof(float)",4,(ulong)(uint)status,0x25);
        abort();
      }
      bsp_move(payload,4);
      payload = payload + 1;
      tag = tag + 1;
    }
  }
  bsp_set_tagsize(&tag_size);
  *local_50 = pfVar4;
  *local_48 = piVar3;
  return nonzeros;
}

Assistant:

int all_gather_sparse_vec( float * dense, int n_over_p,
                            float ** sparse_out,
                            int ** sparse_ivec_out) {
   int global_idx, i, j, tag_size, p, 
       nonzeros, nonzeros_size, status;
   int *sparse_ivec = NULL;
   float *sparse = NULL;

   p = bsp_nprocs();
   tag_size = sizeof(int);
   bsp_set_tagsize(&tag_size);
   bsp_sync();

   for ( i = 0; i < n_over_p; ++i ) {
     if ( dense[i] != 0.0 ) {
       global_idx = n_over_p * bsp_pid() + i;
       for (j = 0; j < p; ++j)
         bsp_send(j, &global_idx, &dense[i], sizeof(float) );
     }
   }
   bsp_sync();

   bsp_qsize( &nonzeros, &nonzeros_size );
   if (nonzeros > 0 ) {
     sparse      = calloc( nonzeros, sizeof(float) );
     sparse_ivec = calloc( nonzeros, sizeof(int) );
     if (sparse == NULL || sparse_ivec == NULL)
       bsp_abort("Unable to allocate memory\n");
 
     for ( i = 0 ; i < nonzeros; ++i) {
       bsp_get_tag( &status, &sparse_ivec[i] );
       EXPECT_EQ( "%d", status, (int) sizeof(float));
       bsp_move( &sparse[i], sizeof(float) );
     }
   }
   bsp_set_tagsize(&tag_size);
   *sparse_out = sparse;
   *sparse_ivec_out = sparse_ivec;
   return nonzeros;
}